

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-priority.c
# Opt level: O3

int run_test_process_priority(void)

{
  int iVar1;
  uv_pid_t pid;
  int iVar2;
  undefined8 uVar3;
  code *unaff_RBX;
  char *pcVar4;
  int *unaff_R14;
  long lVar5;
  int r;
  int priority;
  char acStack_298 [512];
  code *pcStack_98;
  uv_thread_t uStack_68;
  undefined1 auStack_60 [40];
  code *pcStack_38;
  int *piStack_30;
  int local_20;
  int local_1c;
  
  piStack_30 = (int *)0x16584e;
  local_20 = uv_os_getpriority(0,(int *)0x0);
  if (local_20 == -0x16) {
    unaff_RBX = (code *)0xffffffec;
    unaff_R14 = &local_1c;
    local_20 = -0x16;
    do {
      iVar2 = (int)unaff_RBX;
      piStack_30 = (int *)0x165873;
      local_20 = uv_os_setpriority(0,iVar2);
      if (local_20 != -0xd) {
        if (local_20 == 0) {
          piStack_30 = (int *)0x16588a;
          iVar1 = uv_os_getpriority(0,unaff_R14);
          if (iVar1 == 0) {
            if (iVar2 != local_1c) {
LAB_001658eb:
              piStack_30 = (int *)0x1658f0;
              run_test_process_priority_cold_3();
              goto LAB_001658f0;
            }
            piStack_30 = (int *)0x165899;
            pid = uv_os_getpid();
            piStack_30 = (int *)0x1658a3;
            iVar1 = uv_os_getpriority(pid,&local_20);
            if (iVar1 == 0) {
              if (local_1c == local_20) goto LAB_001658b1;
              piStack_30 = (int *)0x1658eb;
              run_test_process_priority_cold_5();
              goto LAB_001658eb;
            }
            goto LAB_001658f5;
          }
        }
        else {
LAB_001658f0:
          piStack_30 = (int *)0x1658f5;
          run_test_process_priority_cold_8();
LAB_001658f5:
          piStack_30 = (int *)0x1658fa;
          run_test_process_priority_cold_4();
        }
        piStack_30 = (int *)0x1658ff;
        run_test_process_priority_cold_2();
        goto LAB_001658ff;
      }
LAB_001658b1:
      unaff_RBX = (code *)(ulong)(iVar2 + 1U);
    } while (iVar2 + 1U != 0x14);
    piStack_30 = (int *)0x1658c4;
    iVar2 = uv_os_setpriority(0,-0x15);
    if (iVar2 != -0x16) goto LAB_00165904;
    piStack_30 = (int *)0x1658d5;
    iVar2 = uv_os_setpriority(0,0x14);
    if (iVar2 == -0x16) {
      return 0;
    }
  }
  else {
LAB_001658ff:
    piStack_30 = (int *)0x165904;
    run_test_process_priority_cold_1();
LAB_00165904:
    piStack_30 = (int *)0x165909;
    run_test_process_priority_cold_6();
  }
  piStack_30 = (int *)0x16590e;
  run_test_process_priority_cold_7();
  pcStack_38 = unaff_RBX;
  piStack_30 = unaff_R14;
  iVar2 = uv_set_process_title
                    ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled");
  if (iVar2 == 0) {
    iVar2 = uv_thread_create(&uStack_68,getter_thread_body,(void *)0x0);
    if (iVar2 != 0) goto LAB_0016599e;
    lVar5 = 0;
    unaff_RBX = setter_thread_body;
    do {
      iVar2 = uv_thread_create((uv_thread_t *)(auStack_60 + lVar5),setter_thread_body,(void *)0x0);
      if (iVar2 != 0) {
        run_test_process_title_threadsafe_cold_3();
        goto LAB_00165994;
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x20);
    unaff_RBX = (code *)0x0;
    while (iVar2 = uv_thread_join((uv_thread_t *)(auStack_60 + (long)unaff_RBX)), iVar2 == 0) {
      unaff_RBX = unaff_RBX + 8;
      if (unaff_RBX == (code *)0x20) {
        return 0;
      }
    }
LAB_00165994:
    run_test_process_title_threadsafe_cold_4();
  }
  run_test_process_title_threadsafe_cold_1();
LAB_0016599e:
  run_test_process_title_threadsafe_cold_2();
  pcStack_98 = unaff_RBX;
  iVar2 = uv_get_process_title(acStack_298,0x200);
  do {
    if (iVar2 != 0) {
      pcVar4 = "0 == uv_get_process_title(buffer, sizeof(buffer))";
      uVar3 = 0x2d;
LAB_00165a73:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,uVar3,pcVar4);
      abort();
    }
    iVar2 = bcmp(acStack_298,
                 "8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled",0x4b);
    if ((((iVar2 != 0) &&
         (iVar2 = bcmp(acStack_298,
                       "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82",
                       0x4b), iVar2 != 0)) &&
        (iVar2 = bcmp(acStack_298,
                      "9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT",
                      0x4b), iVar2 != 0)) &&
       (iVar2 = bcmp(acStack_298,
                     "n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU",
                     0x4b), iVar2 != 0)) {
      pcVar4 = 
      "0 == strcmp(buffer, titles[0]) || 0 == strcmp(buffer, titles[1]) || 0 == strcmp(buffer, titles[2]) || 0 == strcmp(buffer, titles[3])"
      ;
      uVar3 = 0x32;
      goto LAB_00165a73;
    }
    uv_sleep(0);
    iVar2 = uv_get_process_title(acStack_298,0x200);
  } while( true );
}

Assistant:

TEST_IMPL(process_priority) {
  int priority;
  int r;
  int i;

#if defined(__MVS__)
  if (uv_os_setpriority(0, 0) == UV_ENOSYS)
    RETURN_SKIP("functionality not supported on zOS");
#endif

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  r = uv_os_getpriority(0, NULL);
  ASSERT(r == UV_EINVAL);

  /* Verify that all valid values work. */
  for (i = UV_PRIORITY_HIGHEST; i <= UV_PRIORITY_LOW; i++) {
    r = uv_os_setpriority(0, i);

    /* If UV_EACCES is returned, the current user doesn't have permission to
       set this specific priority. */
    if (r == UV_EACCES)
      continue;

    ASSERT(r == 0);
    ASSERT(uv_os_getpriority(0, &priority) == 0);

    /* Verify that the priority values match on Unix, and are range mapped
       on Windows. */
#ifndef _WIN32
    ASSERT(priority == i);
#else
    /* On Windows, only elevated users can set UV_PRIORITY_HIGHEST. Other
       users will silently be set to UV_PRIORITY_HIGH. */
    if (i < UV_PRIORITY_HIGH)
      ASSERT(priority == UV_PRIORITY_HIGHEST || priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_ABOVE_NORMAL)
      ASSERT(priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_NORMAL)
      ASSERT(priority == UV_PRIORITY_ABOVE_NORMAL);
    else if (i < UV_PRIORITY_BELOW_NORMAL)
      ASSERT(priority == UV_PRIORITY_NORMAL);
    else if (i < UV_PRIORITY_LOW)
      ASSERT(priority == UV_PRIORITY_BELOW_NORMAL);
    else
      ASSERT(priority == UV_PRIORITY_LOW);
#endif

    /* Verify that the current PID and 0 are equivalent. */
    ASSERT(uv_os_getpriority(uv_os_getpid(), &r) == 0);
    ASSERT(priority == r);
  }

  /* Verify that invalid priorities return UV_EINVAL. */
  ASSERT(uv_os_setpriority(0, UV_PRIORITY_HIGHEST - 1) == UV_EINVAL);
  ASSERT(uv_os_setpriority(0, UV_PRIORITY_LOW + 1) == UV_EINVAL);

  return 0;
}